

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O2

void __thiscall QDataWidgetMapper::addMapping(QDataWidgetMapper *this,QWidget *widget,int section)

{
  QDataWidgetMapperPrivate *this_00;
  long in_FS_OFFSET;
  QModelIndex local_88;
  WidgetMapper local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDataWidgetMapperPrivate **)(this + 8);
  removeMapping(this,widget);
  QPointer<QWidget>::QPointer<void>(&local_70.widget,widget);
  local_70.section = section;
  QDataWidgetMapperPrivate::indexAt(&local_88,this_00,section);
  QPersistentModelIndex::QPersistentModelIndex(&local_70.currentIndex,&local_88);
  local_70.property.d.d = (Data *)0x0;
  local_70.property.d.ptr = (char *)0x0;
  local_70.property.d.size = 0;
  std::
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ::emplace_back<QDataWidgetMapperPrivate::WidgetMapper>(&this_00->widgetMap,&local_70);
  QDataWidgetMapperPrivate::WidgetMapper::~WidgetMapper(&local_70);
  QObject::installEventFilter(&widget->super_QObject);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::addMapping(QWidget *widget, int section)
{
    Q_D(QDataWidgetMapper);

    removeMapping(widget);
    d->widgetMap.push_back({widget, section, d->indexAt(section), QByteArray()});
    widget->installEventFilter(d->delegate);
}